

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int str_find_aux(lua_State *L,int find)

{
  uint uVar1;
  double *pdVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  GCstr *pGVar6;
  GCstr *pGVar7;
  char *pcVar8;
  int in_ESI;
  long in_RDI;
  bool bVar9;
  char *q_1;
  int anchor;
  char *sstr;
  char *pstr;
  MatchState ms;
  char *q;
  MSize st;
  int32_t start;
  GCstr *p;
  GCstr *s;
  MSize in_stack_fffffffffffffd58;
  MSize in_stack_fffffffffffffd5c;
  uint uVar10;
  lua_State *in_stack_fffffffffffffd60;
  MatchState *ms_00;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  MatchState *in_stack_fffffffffffffda0;
  uint local_68;
  uint local_64;
  
  pGVar6 = lj_lib_checkstr(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  pGVar7 = lj_lib_checkstr(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  iVar3 = lj_lib_optint(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                        in_stack_fffffffffffffd58);
  if (iVar3 < 0) {
    local_64 = pGVar6->len + iVar3;
  }
  else {
    local_64 = iVar3 - 1;
  }
  if ((int)local_64 < 0) {
    local_64 = 0;
  }
  local_68 = local_64;
  if (pGVar6->len < local_64) {
    local_68 = pGVar6->len;
  }
  iVar5 = (int)pGVar6;
  if ((in_ESI == 0) ||
     (((*(ulong *)(in_RDI + 0x18) <= *(long *)(in_RDI + 0x10) + 0x18U ||
       (0xfffffffd < *(uint *)(*(long *)(in_RDI + 0x10) + 0x1c))) &&
      (iVar4 = lj_str_haspattern((GCstr *)CONCAT44(in_stack_fffffffffffffd5c,
                                                   in_stack_fffffffffffffd58)), iVar4 != 0)))) {
    uVar10 = (uint)((char)pGVar7[1].nextgc.gcptr32 == '^');
    uVar1 = pGVar6->len;
    ms_00 = (MatchState *)((long)&pGVar6[1].nextgc.gcptr32 + (ulong)local_68);
    do {
      pcVar8 = match(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      if (pcVar8 != (char *)0x0) {
        if (in_ESI != 0) {
          pdVar2 = *(double **)(in_RDI + 0x18);
          *(double **)(in_RDI + 0x18) = pdVar2 + 1;
          *pdVar2 = (double)((int)ms_00 - (iVar5 + 0xf));
          pdVar2 = *(double **)(in_RDI + 0x18);
          *(double **)(in_RDI + 0x18) = pdVar2 + 1;
          *pdVar2 = (double)((int)pcVar8 - (iVar5 + 0x10));
          iVar5 = push_captures(ms_00,(char *)CONCAT44(uVar10,in_stack_fffffffffffffd58),pcVar8);
          return iVar5 + 2;
        }
        iVar5 = push_captures(ms_00,(char *)CONCAT44(uVar10,in_stack_fffffffffffffd58),pcVar8);
        return iVar5;
      }
      bVar9 = ms_00 < (MatchState *)((long)&pGVar6[1].nextgc.gcptr32 + (ulong)uVar1);
      ms_00 = (MatchState *)((long)&ms_00->src_init + 1);
    } while (bVar9 && uVar10 == 0);
  }
  else {
    pcVar8 = lj_str_find(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60,
                         in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58);
    if (pcVar8 != (char *)0x0) {
      *(double *)(*(long *)(in_RDI + 0x18) + -0x10) = (double)(((int)pcVar8 - (iVar5 + 0x10)) + 1);
      *(double *)(*(long *)(in_RDI + 0x18) + -8) =
           (double)(int)(((int)pcVar8 - (iVar5 + 0x10)) + pGVar7->len);
      return 2;
    }
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + -4) = 0xffffffff;
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  GCstr *p = lj_lib_checkstr(L, 2);
  int32_t start = lj_lib_optint(L, 3, 1);
  MSize st;
  if (start < 0) start += (int32_t)s->len; else start--;
  if (start < 0) start = 0;
  st = (MSize)start;
  if (st > s->len) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    st = s->len;
#endif
  }
  if (find && ((L->base+3 < L->top && tvistruecond(L->base+3)) ||
	       !lj_str_haspattern(p))) {  /* Search for fixed string. */
    const char *q = lj_str_find(strdata(s)+st, strdata(p), s->len-st, p->len);
    if (q) {
      setintV(L->top-2, (int32_t)(q-strdata(s)) + 1);
      setintV(L->top-1, (int32_t)(q-strdata(s)) + (int32_t)p->len);
      return 2;
    }
  } else {  /* Search for pattern. */
    MatchState ms;
    const char *pstr = strdata(p);
    const char *sstr = strdata(s) + st;
    int anchor = 0;
    if (*pstr == '^') { pstr++; anchor = 1; }
    ms.L = L;
    ms.src_init = strdata(s);
    ms.src_end = strdata(s) + s->len;
    do {  /* Loop through string and try to match the pattern. */
      const char *q;
      ms.level = ms.depth = 0;
      q = match(&ms, sstr, pstr);
      if (q) {
	if (find) {
	  setintV(L->top++, (int32_t)(sstr-(strdata(s)-1)));
	  setintV(L->top++, (int32_t)(q-strdata(s)));
	  return push_captures(&ms, NULL, NULL) + 2;
	} else {
	  return push_captures(&ms, sstr, q);
	}
      }
    } while (sstr++ < ms.src_end && !anchor);
  }
  setnilV(L->top-1);  /* Not found. */
  return 1;
}